

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ronan.cpp
# Opt level: O3

void __thiscall
Ronan::syWRonan::SetFrame(syWRonan *this,Phoneme *p1s,Phoneme *p2s,float x,syVRonan *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Phoneme p2;
  Phoneme p1;
  float *p2a [7];
  float *p2b [7];
  float *p2f [7];
  float *p1a [7];
  float *p1b [7];
  float *p1f [7];
  undefined1 local_240 [4];
  undefined1 local_23c [4];
  undefined1 local_238 [4];
  undefined1 local_234 [4];
  undefined1 local_230 [4];
  undefined1 local_22c [4];
  undefined4 local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  undefined1 local_214 [4];
  undefined1 local_210 [4];
  undefined1 local_20c [4];
  undefined1 local_208 [4];
  undefined1 local_204 [4];
  undefined1 local_200 [12];
  undefined1 local_1f4 [4];
  undefined1 local_1f0 [4];
  undefined1 local_1ec [4];
  undefined1 local_1e8 [4];
  undefined1 local_1e4 [4];
  undefined1 local_1e0 [4];
  undefined4 local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  undefined1 local_1c8 [4];
  undefined1 local_1c4 [4];
  undefined1 local_1c0 [4];
  undefined1 local_1bc [4];
  undefined1 local_1b8 [4];
  undefined1 local_1b4 [12];
  undefined1 *local_1a8 [8];
  undefined4 *local_168 [8];
  undefined4 *local_128 [8];
  undefined1 *local_e8 [8];
  undefined4 *local_a8 [8];
  undefined4 *local_68 [8];
  
  local_68[0] = &local_1dc;
  local_68[1] = (undefined4 *)local_1f4;
  local_68[2] = (undefined4 *)local_1ec;
  local_68[3] = (undefined4 *)local_1e4;
  local_68[4] = &f4;
  local_68[5] = &f5;
  local_68[6] = &f6;
  local_a8[0] = &bn;
  local_a8[1] = (undefined4 *)local_1f0;
  local_a8[2] = (undefined4 *)local_1e8;
  local_a8[3] = (undefined4 *)local_1e0;
  local_a8[4] = &b4;
  local_a8[5] = &b5;
  local_a8[6] = &b6;
  local_e8[0] = local_1b8;
  local_e8[1] = local_1c8;
  local_e8[2] = local_1c4;
  local_e8[3] = local_1c0;
  local_e8[4] = local_1bc;
  local_e8[5] = local_1b4;
  local_128[0] = &local_228;
  local_128[2] = (undefined4 *)local_238;
  local_128[3] = (undefined4 *)local_230;
  local_128[4] = &f4;
  local_128[5] = &f5;
  local_128[6] = &f6;
  local_168[0] = &bn;
  local_168[1] = (undefined4 *)local_23c;
  local_168[2] = (undefined4 *)local_234;
  local_168[3] = (undefined4 *)local_22c;
  local_168[4] = &b4;
  local_168[5] = &b5;
  local_168[6] = &b6;
  local_1a8[0] = local_204;
  local_1a8[1] = local_214;
  local_1a8[2] = local_210;
  local_1a8[3] = local_20c;
  local_1a8[4] = local_208;
  local_1a8[5] = local_200;
  local_1a8[6] = local_1a8[5];
  local_128[1] = (undefined4 *)local_240;
  local_e8[6] = local_e8[5];
  memcpy(local_68[1],p1s,0x4c);
  memcpy(local_240,p2s,0x4c);
  pfVar5 = &dest->rdef[0].c;
  lVar4 = 0;
  do {
    fVar8 = **(float **)((long)local_68 + lVar4);
    fVar1 = **(float **)((long)local_128 + lVar4);
    fVar2 = this->pitch;
    fVar7 = **(float **)((long)local_a8 + lVar4);
    fVar3 = **(float **)((long)local_168 + lVar4);
    fVar6 = exp2f(((**(float **)((long)local_1a8 + lVar4) - **(float **)((long)local_e8 + lVar4)) *
                   x + **(float **)((long)local_e8 + lVar4) + -70.0) / 6.0);
    fVar7 = expf(((fVar3 - fVar7) * x + fVar7) * _ZN5RonanL1gE_1);
    *pfVar5 = -fVar7 * fVar7;
    fVar8 = cosf(((fVar1 - fVar8) * x + fVar8) * fVar2 * _ZN5RonanL1gE_2);
    fVar8 = fVar8 * fVar7 + fVar8 * fVar7;
    pfVar5[-1] = fVar8;
    ((ResDef *)(pfVar5 + -2))->a = ((1.0 - fVar8) - *pfVar5) * fVar6;
    lVar4 = lVar4 + 8;
    pfVar5 = pfVar5 + 3;
  } while (lVar4 != 0x38);
  fVar8 = exp2f(((local_224 - local_1d8) * x + local_1d8 + -70.0) / 6.0);
  dest->a_voicing = fVar8;
  fVar8 = exp2f(((local_220 - local_1d4) * x + local_1d4 + -70.0) / 6.0);
  dest->a_aspiration = fVar8;
  fVar8 = exp2f(((local_21c - local_1d0) * x + local_1d0 + -70.0) / 6.0);
  dest->a_frication = fVar8;
  fVar8 = exp2f(((local_218 - local_1cc) * x + local_1cc + -70.0) / 6.0);
  dest->a_bypass = fVar8;
  return;
}

Assistant:

void SetFrame(const Phoneme &p1s, const Phoneme &p2s, const float x, syVRonan &dest)
    {
        Phoneme p1,p2;

        const float * const p1f[] = { &p1.fnf, &p1.f1f, &p1.f2f, &p1.f3f, &f4    , &f5     , &f6};
        const float * const p1b[] = { &bn    , &p1.f1b, &p1.f2b, &p1.f3b, &b4    , &b5     , &b6};
        const float * const p1a[] = { &p1.a_n, &p1.a_1, &p1.a_2, &p1.a_3, &p1.a_4, &p1.a_56, &p1.a_56};

        const float * const p2f[] = { &p2.fnf, &p2.f1f, &p2.f2f, &p2.f3f, &f4    , &f5     , &f6};
        const float * const p2b[] = { &bn    , &p2.f1b, &p2.f2b, &p2.f3b, &b4    , &b5     , &b6};
        const float * const p2a[] = { &p2.a_n, &p2.a_1, &p2.a_2, &p2.a_3, &p2.a_4, &p2.a_56, &p2.a_56};

        p1 = p1s;
        p2 = p2s;

        for (int i = 0; i < 7; i++)
            dest.rdef[i].set(flerp(*p1f[i], *p2f[i], x)*pitch, flerp(*p1b[i], *p2b[i], x), db2lin(*p1a[i], *p2a[i], x));

        dest.a_voicing    = db2lin(p1.a_voicing, p2.a_voicing, x);
        dest.a_aspiration = db2lin(p1.a_aspiration, p2.a_aspiration, x);
        dest.a_frication  = db2lin(p1.a_frication, p2.a_frication, x);
        dest.a_bypass     = db2lin(p1.a_bypass, p2.a_bypass, x);
    }